

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadable.h
# Opt level: O1

void __thiscall chrono::ChNodeXYZ::ChNodeXYZ(ChNodeXYZ *this,void **vtt,ChNodeXYZ *other)

{
  ChLoadableUVW CVar1;
  
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->pos).m_data + *(long *)((long)CVar1 + -0x78) + -8) = vtt[2];
  CVar1 = (ChLoadableUVW)*vtt;
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)(this->pos).m_data + *(long *)((long)CVar1 + -0x80) + -8) = vtt[3];
  *(void **)((long)(this->pos).m_data + *(long *)((long)this->super_ChLoadableUVW + -0x78) + -8) =
       vtt[4];
  (this->pos).m_data[0] = 0.0;
  (this->pos).m_data[1] = 0.0;
  (this->pos).m_data[2] = 0.0;
  (this->pos_dt).m_data[0] = 0.0;
  (this->pos_dt).m_data[1] = 0.0;
  (this->pos_dt).m_data[2] = 0.0;
  (this->pos_dtdt).m_data[0] = 0.0;
  (this->pos_dtdt).m_data[1] = 0.0;
  (this->pos_dtdt).m_data[2] = 0.0;
  if (other != this) {
    (this->pos).m_data[0] = (other->pos).m_data[0];
    (this->pos).m_data[1] = (other->pos).m_data[1];
    (this->pos).m_data[2] = (other->pos).m_data[2];
    (this->pos_dt).m_data[0] = (other->pos_dt).m_data[0];
    (this->pos_dt).m_data[1] = (other->pos_dt).m_data[1];
    (this->pos_dt).m_data[2] = (other->pos_dt).m_data[2];
    (this->pos_dtdt).m_data[0] = (other->pos_dtdt).m_data[0];
    (this->pos_dtdt).m_data[1] = (other->pos_dtdt).m_data[1];
    (this->pos_dtdt).m_data[2] = (other->pos_dtdt).m_data[2];
  }
  return;
}

Assistant:

virtual public ChLoadable {
  public:
    virtual ~ChLoadableUVW() {}

    /// Evaluate N'*F , where N is some type of shape function
    /// evaluated at U,V,W coordinates of the volume, each ranging in [-1..+1], except if IsTetrahedronIntegrationNeeded() true or IsTrianglePrismIntegrationNeeded() true.
    /// F is a load, N'*F is the resulting generalized load
    /// Returns also det[J] with J=[dx/du,..], that might be useful in gauss quadrature.
    virtual void ComputeNF(const double U,              ///< parametric coordinate in volume
                           const double V,              ///< parametric coordinate in volume
                           const double W,              ///< parametric coordinate in volume
                           ChVectorDynamic<>& Qi,       ///< Return result of N'*F  here, maybe with offset block_offset
                           double& detJ,                ///< Return det[J] here
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) = 0;

    /// This can be useful for loadable objects that has some density property, so it can be
    /// accessed by ChLoaderVolumeGravity. Return 0 if the element/nodes does not support xyz gravity.
    virtual double GetDensity() = 0;

    /// If true, use quadrature over u,v,w in [0..1] range as tetrahedron volumetric coords (with z=1-u-v-w)
    /// otherwise use default quadrature over u,v,w in [-1..+1] as box isoparametric coords.
    virtual bool IsTetrahedronIntegrationNeeded() { return false; }

	/// If true, use quadrature over u,v  in [0..1] range as triangle natural coords (with z=1-u-v), and use linear quadrature over w in [-1..+1],
    /// otherwise use default quadrature over u,v,w in [-1..+1] as box isoparametric coords.
    virtual bool IsTrianglePrismIntegrationNeeded() { return false; }

}